

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.cpp
# Opt level: O2

bool __thiscall TPZSavable::Compare(TPZSavable *this,TPZSavable *copy,bool override)

{
  int iVar1;
  ostream *poVar2;
  stringstream sout;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = std::operator<<(local_188,"Class id ");
  iVar1 = (*this->_vptr_TPZSavable[4])(this);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2," Compare needs to be implemented");
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<((ostream *)&std::cout,asStack_1b8);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(asStack_1b8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return false;
}

Assistant:

bool TPZSavable::Compare(TPZSavable *copy, bool override) const
{
	std::stringstream sout;
	sout << "Class id " << ClassId() << " Compare needs to be implemented";
	LOGPZ_ERROR(loggerCheck,sout.str())
	return false;
}